

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.cpp
# Opt level: O2

void __thiscall embree::Points::commit(Points *this)

{
  size_t *psVar1;
  RawBufferView *pRVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  RawBufferView *pRVar4;
  size_t sVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  BufferView<embree::Vec3fa> *pBVar9;
  size_t *psVar10;
  allocator local_39;
  string local_38 [32];
  
  pRVar2 = &((this->vertices).items)->super_RawBufferView;
  psVar1 = &pRVar2->stride;
  uVar8 = 0xffffffffffffffff;
  psVar10 = psVar1;
  do {
    uVar8 = uVar8 + 1;
    if ((this->super_Geometry).numTimeSteps <= uVar8) {
      pBVar3 = (this->normals).items;
      lVar7 = (this->normals).size_active * 0x38;
      pBVar9 = pBVar3;
      do {
        if (lVar7 == 0) {
          RawBufferView::operator=((RawBufferView *)&(this->super_Geometry).field_0x58,pRVar2);
          if (*(char *)&(this->super_Geometry).field_8 == '\x1b') {
            RawBufferView::operator=
                      (&(this->normals0).super_RawBufferView,
                       &((this->normals).items)->super_RawBufferView);
          }
          Geometry::commit(&this->super_Geometry);
          return;
        }
        pRVar4 = &pBVar9->super_RawBufferView;
        pBVar9 = pBVar9 + 1;
        lVar7 = lVar7 + -0x38;
      } while ((int)pRVar4->stride == (int)(pBVar3->super_RawBufferView).stride);
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                (local_38,"stride of normal buffers have to be identical for each time step",
                 &local_39);
      *puVar6 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar6 + 1) = 3;
      std::__cxx11::string::string((string *)(puVar6 + 2),local_38);
      __cxa_throw(puVar6,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    sVar5 = *psVar10;
    psVar10 = psVar10 + 7;
  } while ((int)sVar5 == (int)*psVar1);
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            (local_38,"stride of vertex buffers have to be identical for each time step",&local_39);
  *puVar6 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar6 + 1) = 3;
  std::__cxx11::string::string((string *)(puVar6 + 2),local_38);
  __cxa_throw(puVar6,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

void Points::commit()
  {
    /* verify that stride of all time steps are identical */
    for (unsigned int t = 0; t < numTimeSteps; t++) {
      if (vertices[t].getStride() != vertices[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION, "stride of vertex buffers have to be identical for each time step");
      vertices[t].buffer->commitIfNeeded();
    }
    for (auto& buffer : normals) {
      if (buffer.getStride() != normals[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION, "stride of normal buffers have to be identical for each time step");
      buffer.buffer->commitIfNeeded();
    }
    vertices0 = vertices[0];
    if (getType() == GTY_ORIENTED_DISC_POINT)
      normals0 = normals[0];

    Geometry::commit();
  }